

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O2

void __thiscall
xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>>::
t_derived<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*,xemmai::t_object*&,unsigned_long_const&,unsigned_long,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>&,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>&>
          (t_derived<xemmai::t_type_of<xemmai::t_throwable>> *this,array<const_void_*,_2UL> *a_xs,
          t_type_of<xemmai::t_object> **a_xs_1,t_object **a_xs_2,unsigned_long *a_xs_3,
          unsigned_long *a_xs_4,
          vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
          *a_xs_5,map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
                  *a_xs_6)

{
  t_derivable<xemmai::t_holds<xemmai::t_throwable,xemmai::t_type_of<xemmai::t_object>>,xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>>>
  ::
  t_derivable<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*,xemmai::t_object*&,unsigned_long_const&,unsigned_long,std::vector<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>,std::allocator<std::pair<xemmai::t_root,xemmai::t_value<xemmai::t_root>>>>&,std::map<xemmai::t_object*,unsigned_long,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,unsigned_long>>>&>
            ((t_derivable<xemmai::t_holds<xemmai::t_throwable,xemmai::t_type_of<xemmai::t_object>>,xemmai::t_derived<xemmai::t_type_of<xemmai::t_throwable>>>
              *)this,a_xs,a_xs_1,a_xs_2,a_xs_3,a_xs_4,a_xs_5,a_xs_6);
  *(code **)(this + 0xb8) = t_type_of<xemmai::t_object>::f_do_call;
  *(code **)(this + 0xc0) = t_type_of<xemmai::t_object>::f_do_string;
  *(code **)(this + 200) = t_type_of<xemmai::t_object>::f_do_hash;
  *(code **)(this + 0xd0) = t_type_of<xemmai::t_object>::f_do_get_at;
  *(code **)(this + 0xd8) = t_type_of<xemmai::t_object>::f_do_set_at;
  *(code **)(this + 0xe0) = t_type_of<xemmai::t_object>::f_do_plus;
  *(code **)(this + 0xe8) = t_type_of<xemmai::t_object>::f_do_minus;
  *(code **)(this + 0xf0) = t_type_of<xemmai::t_object>::f_do_complement;
  *(code **)(this + 0xf8) = t_type_of<xemmai::t_object>::f_do_multiply;
  *(code **)(this + 0x100) = t_type_of<xemmai::t_object>::f_do_divide;
  *(code **)(this + 0x108) = t_type_of<xemmai::t_object>::f_do_modulus;
  *(code **)(this + 0x110) = t_type_of<xemmai::t_object>::f_do_add;
  *(code **)(this + 0x118) = t_type_of<xemmai::t_object>::f_do_subtract;
  *(code **)(this + 0x120) = t_type_of<xemmai::t_object>::f_do_left_shift;
  *(code **)(this + 0x128) = t_type_of<xemmai::t_object>::f_do_right_shift;
  *(code **)(this + 0x130) = t_type_of<xemmai::t_object>::f_do_less;
  *(code **)(this + 0x138) = t_type_of<xemmai::t_object>::f_do_less_equal;
  *(code **)(this + 0x140) = t_type_of<xemmai::t_object>::f_do_greater;
  *(code **)(this + 0x148) = t_type_of<xemmai::t_object>::f_do_greater_equal;
  *(code **)(this + 0x150) = t_type_of<xemmai::t_object>::f_do_equals;
  *(code **)(this + 0x158) = t_type_of<xemmai::t_object>::f_do_not_equals;
  *(code **)(this + 0x160) = t_type_of<xemmai::t_object>::f_do_and;
  *(code **)(this + 0x168) = t_type_of<xemmai::t_object>::f_do_xor;
  *(code **)(this + 0x170) = t_type_of<xemmai::t_object>::f_do_or;
  return;
}

Assistant:

t_derived(auto&&... a_xs) : T(std::forward<decltype(a_xs)>(a_xs)...)
	{
		this->f_call = t_type::f_do_call;
		this->f_string = t_type::f_do_string;
		this->f_hash = t_type::f_do_hash;
		this->f_get_at = t_type::f_do_get_at;
		this->f_set_at = t_type::f_do_set_at;
		this->f_plus = t_type::f_do_plus;
		this->f_minus = t_type::f_do_minus;
		this->f_complement = t_type::f_do_complement;
		this->f_multiply = t_type::f_do_multiply;
		this->f_divide = t_type::f_do_divide;
		this->f_modulus = t_type::f_do_modulus;
		this->f_add = t_type::f_do_add;
		this->f_subtract = t_type::f_do_subtract;
		this->f_left_shift = t_type::f_do_left_shift;
		this->f_right_shift = t_type::f_do_right_shift;
		this->f_less = t_type::f_do_less;
		this->f_less_equal = t_type::f_do_less_equal;
		this->f_greater = t_type::f_do_greater;
		this->f_greater_equal = t_type::f_do_greater_equal;
		this->f_equals = t_type::f_do_equals;
		this->f_not_equals = t_type::f_do_not_equals;
		this->f_and = t_type::f_do_and;
		this->f_xor = t_type::f_do_xor;
		this->f_or = t_type::f_do_or;
	}